

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O3

int AF_A_CorpseBloodDrip(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  PClass *pPVar5;
  PClassActor *type;
  undefined8 *puVar6;
  char *__assertion;
  bool bVar7;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e262b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar6 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar6 == (undefined8 *)0x0) {
LAB_005e24dd:
        puVar6 = (undefined8 *)0x0;
      }
      else {
        pPVar5 = (PClass *)puVar6[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar6)(puVar6);
          puVar6[1] = pPVar5;
        }
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e262b;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e259d;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e261b;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar7) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar7 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar7) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e262b;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e261b;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e259d:
        uVar4 = FRandom::GenRand32(&pr_drip);
        if ((uVar4 & 0xff) < 0x81) {
          local_4c.Index = FName::NameManager::FindName(&FName::NameData,"CorpseBloodDrip",false);
          local_48.Z = (double)puVar6[0x2c] * 0.5 + (double)puVar6[0xb];
          local_48.X = (double)puVar6[9];
          local_48.Y = (double)puVar6[10];
          type = ClassForSpawn(&local_4c);
          AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e262b;
    }
    if (puVar6 == (undefined8 *)0x0) goto LAB_005e24dd;
  }
LAB_005e261b:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e262b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x9b,"int AF_A_CorpseBloodDrip(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CorpseBloodDrip)
{
	PARAM_ACTION_PROLOGUE;

	if (pr_drip() <= 128)
	{
		Spawn ("CorpseBloodDrip", self->PosPlusZ(self->Height / 2), ALLOW_REPLACE);
	}
	return 0;
}